

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

bool __thiscall
Clasp::mt::SharedLitsClause::updateWatch(SharedLitsClause *this,Solver *s,uint32 pos)

{
  uint uVar1;
  SharedLiterals *pSVar2;
  pointer puVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  SharedLiterals *pSVar7;
  uint uVar8;
  
  pSVar2 = (this->super_ClauseHead).field_0.shared_;
  uVar5 = pSVar2->size_type_;
  bVar4 = uVar5 >= 4;
  if (uVar5 < 4) {
    return bVar4;
  }
  uVar1 = (this->super_ClauseHead).head_[pos ^ 1].rep_;
  pSVar7 = pSVar2 + 1;
  puVar3 = (s->assign_).assign_.ebo_.buf;
  uVar8 = pSVar2[1].refCount_.super___atomic_base<int>._M_i;
  if (((byte)(*(byte *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffc)) & 3) ==
       (byte)(((uVar8 & 2) == 0) + 1U)) || ((uVar8 ^ uVar1) < 2)) {
    lVar6 = (ulong)(uVar5 & 0xfffffffc) - 4;
    do {
      bVar4 = lVar6 != 0;
      if (lVar6 == 0) {
        return bVar4;
      }
      pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
      uVar8 = *(uint *)pSVar7;
      lVar6 = lVar6 + -4;
    } while (((byte)(*(byte *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffc)) & 3) ==
              (byte)(((uVar8 & 2) == 0) + 1U)) || ((uVar8 ^ uVar1) < 2));
  }
  (this->super_ClauseHead).head_[pos].rep_ = uVar8;
  uVar8 = (uint)((long)pSVar2 + (((ulong)(uVar5 & 0xfffffffc) + 8) - (long)pSVar7) >> 2);
  uVar5 = 8;
  if (uVar8 < 8) {
    uVar5 = uVar8;
  }
  switch(uVar5) {
  case 2:
switchD_00185c02_caseD_2:
    uVar5 = pSVar7->size_type_;
    if ((byte)(*(byte *)((long)puVar3 + (ulong)(uVar5 & 0xfffffffc)) & 3) ==
        (byte)(((uVar5 & 2) == 0) + 1U)) {
      return bVar4;
    }
    if ((uVar1 ^ uVar5) < 2) {
      return bVar4;
    }
    break;
  case 3:
switchD_00185c02_caseD_3:
    uVar5 = pSVar7->size_type_;
    pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
    if (((byte)(*(byte *)((long)puVar3 + (ulong)(uVar5 & 0xfffffffc)) & 3) ==
         (byte)(((uVar5 & 2) == 0) + 1U)) || ((uVar5 ^ uVar1) < 2)) goto switchD_00185c02_caseD_2;
    break;
  case 4:
switchD_00185c02_caseD_4:
    uVar5 = pSVar7->size_type_;
    pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
    if (((byte)(*(byte *)((long)puVar3 + (ulong)(uVar5 & 0xfffffffc)) & 3) ==
         (byte)(((uVar5 & 2) == 0) + 1U)) || ((uVar5 ^ uVar1) < 2)) goto switchD_00185c02_caseD_3;
    break;
  case 5:
switchD_00185c02_caseD_5:
    uVar5 = pSVar7->size_type_;
    pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
    if (((byte)(*(byte *)((long)puVar3 + (ulong)(uVar5 & 0xfffffffc)) & 3) ==
         (byte)(((uVar5 & 2) == 0) + 1U)) || ((uVar5 ^ uVar1) < 2)) goto switchD_00185c02_caseD_4;
    break;
  case 6:
switchD_00185c02_caseD_6:
    uVar5 = pSVar7->size_type_;
    pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
    if (((byte)(*(byte *)((long)puVar3 + (ulong)(uVar5 & 0xfffffffc)) & 3) ==
         (byte)(((uVar5 & 2) == 0) + 1U)) || ((uVar5 ^ uVar1) < 2)) goto switchD_00185c02_caseD_5;
    break;
  case 7:
switchD_00185c02_caseD_7:
    uVar5 = pSVar7->size_type_;
    pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
    if (((byte)(*(byte *)((long)puVar3 + (ulong)(uVar5 & 0xfffffffc)) & 3) ==
         (byte)(((uVar5 & 2) == 0) + 1U)) || ((uVar5 ^ uVar1) < 2)) goto switchD_00185c02_caseD_6;
    break;
  case 8:
    uVar5 = pSVar7->size_type_;
    pSVar7 = (SharedLiterals *)&pSVar7->size_type_;
    if (((byte)(*(byte *)((long)puVar3 + (ulong)(uVar5 & 0xfffffffc)) & 3) ==
         (byte)(((uVar5 & 2) == 0) + 1U)) || ((uVar5 ^ uVar1) < 2)) goto switchD_00185c02_caseD_7;
    break;
  default:
    goto switchD_00185c02_default;
  }
  (this->super_ClauseHead).head_[2].rep_ = uVar5;
switchD_00185c02_default:
  return bVar4;
}

Assistant:

bool SharedLitsClause::updateWatch(Solver& s, uint32 pos) {
	Literal  other = head_[1^pos];
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		// at this point we know that head_[2] is false, so we only need to check
		// that we do not watch the other watched literal twice!
		if (!s.isFalse(*r) && *r != other) {
			head_[pos] = *r; // replace watch
			// try to replace cache literal
			switch( std::min(static_cast<uint32>(8), static_cast<uint32>(end-r)) ) {
				case 8: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 7: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 6: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 5: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 4: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 3: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 2: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				default: return true;
			}
		}
	}
	return false;
}